

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# form.h
# Opt level: O2

void __thiscall cppcms::widgets::numeric<double>::numeric(numeric<double> *this)

{
  allocator local_31;
  string local_30 [32];
  
  cppcms::widgets::base_widget::base_widget((base_widget *)&this->field_0x70);
  std::__cxx11::string::string(local_30,"text",&local_31);
  cppcms::widgets::base_html_input::base_html_input
            (&this->super_base_html_input,(string *)&PTR_construction_vtable_24__00111a28);
  std::__cxx11::string::~string(local_30);
  *(undefined8 *)this = 0x111940;
  *(undefined8 *)&this->field_0x70 = 0x1119d0;
  this->check_low_ = false;
  this->check_high_ = false;
  this->non_empty_ = false;
  (this->loaded_string_)._M_dataplus._M_p = (pointer)&(this->loaded_string_).field_2;
  (this->loaded_string_)._M_string_length = 0;
  (this->loaded_string_).field_2._M_local_buf[0] = '\0';
  return;
}

Assistant:

numeric() :
				base_html_input("text"),
				check_low_(false),
				check_high_(false),
				non_empty_(false)
			{
			}